

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

void Cmd_playsound(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  FSoundID local_24;
  FSoundID local_20;
  int local_1c;
  FSoundID id;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  local_1c = key;
  _id = who;
  iVar1 = FCommandLine::argc(argv);
  if (1 < iVar1) {
    pcVar2 = FCommandLine::operator[](argv,1);
    FSoundID::FSoundID(&local_20,pcVar2);
    iVar1 = FSoundID::operator_cast_to_int(&local_20);
    if (iVar1 == 0) {
      pcVar2 = FCommandLine::operator[](argv,1);
      Printf("\'%s\' is not a sound\n",pcVar2);
    }
    else {
      FSoundID::FSoundID(&local_24,&local_20);
      S_Sound(0x20,&local_24,1.0,0.0);
    }
  }
  return;
}

Assistant:

CCMD (playsound)
{
	if (argv.argc() > 1)
	{
		FSoundID id = argv[1];
		if (id == 0)
		{
			Printf("'%s' is not a sound\n", argv[1]);
		}
		else
		{
			S_Sound (CHAN_AUTO | CHAN_UI, id, 1.f, ATTN_NONE);
		}
	}
}